

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.c
# Opt level: O2

void test_mixed_long_short(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *local_78;
  char *av [7];
  char *a;
  int v;
  int opti;
  
  av[6] = (char *)0x0;
  a._4_4_ = 1;
  local_78 = "program";
  av[0] = "--value=123";
  av[1] = "-f";
  av[2] = "--longflag";
  av[3] = "-b";
  av[4] = "-vxyz";
  av[5] = "456";
  nVar1 = nng_args_parse(7,&local_78,case1,(int *)&a,av + 6,(int *)((long)&a + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0xef,"%s: expected success, got %s (%d)",
                         "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
  if (iVar2 != 0) {
    acutest_check_((uint)(a._4_4_ == 2),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                   ,0xf0,"%s","opti == 2");
    acutest_check_((uint)((int)a == 3),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                   ,0xf1,"%s","v == 3");
    pcVar3 = av[6];
    iVar2 = strcmp(av[6],"123");
    acutest_check_((uint)(iVar2 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                   ,0xf2,"%s == %s",pcVar3,"123",nVar1);
    nVar1 = nng_args_parse(7,&local_78,case1,(int *)&a,av + 6,(int *)((long)&a + 4));
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                           ,0xf3,"%s: expected success, got %s (%d)",
                           "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
    if (iVar2 != 0) {
      acutest_check_((uint)(a._4_4_ == 3),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                     ,0xf4,"%s","opti == 3");
      acutest_check_((uint)((int)a == 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                     ,0xf5,"%s","v == 1");
      nVar1 = nng_args_parse(7,&local_78,case1,(int *)&a,av + 6,(int *)((long)&a + 4));
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                             ,0xf6,"%s: expected success, got %s (%d)",
                             "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
      if (iVar2 != 0) {
        acutest_check_((uint)(a._4_4_ == 4),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                       ,0xf7,"%s","opti == 4");
        acutest_check_((uint)((int)a == 2),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                       ,0xf8,"%s","v == 2");
        nVar1 = nng_args_parse(7,&local_78,case1,(int *)&a,av + 6,(int *)((long)&a + 4));
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                               ,0xf9,"%s: expected success, got %s (%d)",
                               "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
        if (iVar2 != 0) {
          acutest_check_((uint)(a._4_4_ == 5),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0xfa,"%s","opti == 5");
          acutest_check_((uint)((int)a == 4),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0xfb,"%s","v == 4");
          nVar1 = nng_args_parse(7,&local_78,case1,(int *)&a,av + 6,(int *)((long)&a + 4));
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                                 ,0xfc,"%s: expected success, got %s (%d)",
                                 "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar3,nVar1);
          if (iVar2 != 0) {
            lVar4 = (long)a._4_4_;
            acutest_check_((uint)(lVar4 == 6),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                           ,0xfd,"%s","opti == 6");
            acutest_check_((uint)((int)a == 3),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                           ,0xfe,"%s","v == 3");
            pcVar3 = av[6];
            iVar2 = strcmp(av[6],"xyz");
            acutest_check_((uint)(iVar2 == 0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                           ,0xff,"%s == %s",pcVar3,"xyz",nVar1);
            pcVar3 = av[lVar4 + -1];
            iVar2 = strcmp(pcVar3,"456");
            acutest_check_((uint)(iVar2 == 0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                           ,0x100,"%s == %s",pcVar3,"456");
            iVar2 = nng_args_parse(7,&local_78,case1,(int *)&a,av + 6,(int *)((long)&a + 4));
            acutest_check_((uint)(iVar2 == -1),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                           ,0x101,"%s","nng_args_parse(ac, av, case1, &v, &a, &opti) == -1");
            acutest_check_((uint)(a._4_4_ == 6),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                           ,0x102,"%s","opti == 6");
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_mixed_long_short(void)
{
	int   opti = 1;
	char *av[7];
	int   ac = 7;
	int   v;
	char *a = NULL;

	av[0] = "program";
	av[1] = "--value=123";
	av[2] = "-f";
	av[3] = "--longflag";
	av[4] = "-b";
	av[5] = "-vxyz";
	av[6] = "456";
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 2);
	NUTS_TRUE(v == 3);
	NUTS_MATCH(a, "123");
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 3);
	NUTS_TRUE(v == 1);
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 4);
	NUTS_TRUE(v == 2);
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 5);
	NUTS_TRUE(v == 4);
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 6);
	NUTS_TRUE(v == 3);
	NUTS_MATCH(a, "xyz");
	NUTS_MATCH(av[opti], "456");
	NUTS_TRUE(nng_args_parse(ac, av, case1, &v, &a, &opti) == -1);
	NUTS_TRUE(opti == 6);
}